

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O2

int duckdb_lz4::LZ4_decompress_safe_usingDict
              (char *source,char *dest,int compressedSize,int maxOutputSize,char *dictStart,
              int dictSize)

{
  int iVar1;
  size_t dictSize_00;
  
  if (dictSize == 0) {
    iVar1 = LZ4_decompress_safe(source,dest,compressedSize,maxOutputSize);
    return iVar1;
  }
  dictSize_00 = (size_t)dictSize;
  if (dictStart + dictSize_00 == dest) {
    if (dictSize < 0xffff) {
      iVar1 = LZ4_decompress_safe_withSmallPrefix
                        (source,dest,compressedSize,maxOutputSize,dictSize_00);
      return iVar1;
    }
    iVar1 = LZ4_decompress_safe_withPrefix64k(source,dest,compressedSize,maxOutputSize);
    return iVar1;
  }
  iVar1 = LZ4_decompress_safe_forceExtDict
                    (source,dest,compressedSize,maxOutputSize,dictStart,dictSize_00);
  return iVar1;
}

Assistant:

int LZ4_decompress_safe_usingDict(const char* source, char* dest, int compressedSize, int maxOutputSize, const char* dictStart, int dictSize)
{
    if (dictSize==0)
        return LZ4_decompress_safe(source, dest, compressedSize, maxOutputSize);
    if (dictStart+dictSize == dest) {
        if (dictSize >= 64 KB - 1) {
            return LZ4_decompress_safe_withPrefix64k(source, dest, compressedSize, maxOutputSize);
        }
        assert(dictSize >= 0);
        return LZ4_decompress_safe_withSmallPrefix(source, dest, compressedSize, maxOutputSize, (size_t)dictSize);
    }
    assert(dictSize >= 0);
    return LZ4_decompress_safe_forceExtDict(source, dest, compressedSize, maxOutputSize, dictStart, (size_t)dictSize);
}